

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_field_info.h
# Opt level: O0

void __thiscall
google::protobuf::internal::MapDynamicFieldInfo<proto2_unittest::TestMap>::MapDynamicFieldInfo
          (MapDynamicFieldInfo<proto2_unittest::TestMap> *this,Reflection *r,TestMap *m,
          FieldDescriptor *f,FieldDescriptor *key_f,FieldDescriptor *val_f,MapFieldBase *map_field)

{
  bool bVar1;
  FieldDescriptor **ppFVar2;
  void **ppvVar3;
  char *pcVar4;
  LogMessage *pLVar5;
  LogMessage local_a8;
  Voidify local_91;
  void *local_90;
  Nullable<const_char_*> local_88;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_69;
  void *local_68;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  LogMessage local_50;
  Voidify local_39;
  FieldDescriptor *local_38;
  FieldDescriptor *val_f_local;
  FieldDescriptor *key_f_local;
  FieldDescriptor *f_local;
  TestMap *m_local;
  Reflection *r_local;
  MapDynamicFieldInfo<proto2_unittest::TestMap> *this_local;
  
  this->reflection = r;
  this->message = m;
  this->field = f;
  this->key = key_f;
  this->value = val_f;
  this->const_map_field = map_field;
  local_38 = val_f;
  val_f_local = key_f;
  key_f_local = f;
  f_local = (FieldDescriptor *)m;
  m_local = (TestMap *)r;
  r_local = (Reflection *)this;
  bVar1 = FieldDescriptor::is_map(f);
  absl_log_internal_check_op_result._7_1_ = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_field_info.h"
               ,0x543,"f->is_map()");
    absl_log_internal_check_op_result._7_1_ = 1;
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar5);
  }
  if ((absl_log_internal_check_op_result._7_1_ & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  ppFVar2 = absl::lts_20250127::log_internal::
            GetReferenceableValue<google::protobuf::FieldDescriptor_const*>(&val_f_local);
  local_68 = (void *)0x0;
  ppvVar3 = absl::lts_20250127::log_internal::GetReferenceableValue<decltype(nullptr)>(&local_68);
  local_60 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::FieldDescriptor_const*,decltype(nullptr)>
                       (ppFVar2,ppvVar3,"key_f != nullptr");
  if (local_60 != (Nullable<const_char_*>)0x0) {
    pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_60);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_field_info.h"
               ,0x544,pcVar4);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)&absl_log_internal_check_op_result_1);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar5);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
  }
  ppFVar2 = absl::lts_20250127::log_internal::
            GetReferenceableValue<google::protobuf::FieldDescriptor_const*>(&local_38);
  local_90 = (void *)0x0;
  ppvVar3 = absl::lts_20250127::log_internal::GetReferenceableValue<decltype(nullptr)>(&local_90);
  local_88 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::FieldDescriptor_const*,decltype(nullptr)>
                       (ppFVar2,ppvVar3,"val_f != nullptr");
  if (local_88 == (Nullable<const_char_*>)0x0) {
    return;
  }
  pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_88);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_field_info.h"
             ,0x545,pcVar4);
  pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a8);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar5);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_a8);
}

Assistant:

constexpr MapDynamicFieldInfo(const Reflection* r, MessageT& m,
                                const FieldDescriptor* f,
                                const FieldDescriptor* key_f,
                                const FieldDescriptor* val_f,
                                const MapFieldBase& map_field)
      : reflection(r),
        message(m),
        field(f),
        key(key_f),
        value(val_f),
        const_map_field(map_field) {
    ABSL_DCHECK(f->is_map());
    ABSL_DCHECK_NE(key_f, nullptr);
    ABSL_DCHECK_NE(val_f, nullptr);
  }